

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void zeroblobFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int errCode;
  sqlite3_context *pCtx;
  sqlite3_context *in_RDX;
  int rc;
  i64 n;
  
  pCtx = (sqlite3_context *)sqlite3_value_int64((sqlite3_value *)0x2251ca);
  if ((long)pCtx < 0) {
    pCtx = (sqlite3_context *)0x0;
  }
  errCode = sqlite3_result_zeroblob64(in_RDX,(u64)pCtx);
  if (errCode != 0) {
    sqlite3_result_error_code(pCtx,errCode);
  }
  return;
}

Assistant:

static void zeroblobFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  i64 n;
  int rc;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  n = sqlite3_value_int64(argv[0]);
  if( n<0 ) n = 0;
  rc = sqlite3_result_zeroblob64(context, n); /* IMP: R-00293-64994 */
  if( rc ){
    sqlite3_result_error_code(context, rc);
  }
}